

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_nor(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint uVar1;
  BtorSimBitVector *pBVar2;
  ulong uVar3;
  
  pBVar2 = btorsim_bv_new(a->width);
  uVar1 = a->len;
  if ((ulong)uVar1 != 0) {
    uVar3 = 0;
    do {
      (&pBVar2[1].width)[uVar3] = ~((&b[1].width)[uVar3] | (&a[1].width)[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if ((ulong)pBVar2->len << 5 != (ulong)pBVar2->width) {
    pBVar2[1].width = pBVar2[1].width & 0x7fffffffU >> (~(byte)pBVar2->width & 0x1f);
  }
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_nor (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint32_t i;
  BtorSimBitVector *res;

  res = btorsim_bv_new (a->width);
  for (i = 0; i < a->len; i++) res->bits[i] = ~(a->bits[i] | b->bits[i]);

  set_rem_bits_to_zero (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}